

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O2

void __thiscall
crnlib::mipmapped_texture::set_orientation_flags(mipmapped_texture *this,orientation_flags_t flags)

{
  vector<crnlib::mip_level_*> *pvVar1;
  uint l;
  ulong uVar2;
  uint m;
  ulong uVar3;
  
  for (uVar2 = 0; uVar2 < (this->m_faces).m_size; uVar2 = uVar2 + 1) {
    for (uVar3 = 0; pvVar1 = (this->m_faces).m_p, uVar3 < pvVar1[uVar2].m_size; uVar3 = uVar3 + 1) {
      pvVar1[uVar2].m_p[uVar3]->m_orient_flags = flags;
    }
  }
  return;
}

Assistant:

void mipmapped_texture::set_orientation_flags(orientation_flags_t flags) {
  for (uint l = 0; l < m_faces.size(); l++)
    for (uint m = 0; m < m_faces[l].size(); m++)
      m_faces[l][m]->set_orientation_flags(flags);
}